

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::ScaleTexture::readFrom(ScaleTexture *this,BinaryReader *binary)

{
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  Texture::readFrom((Texture *)in_RDI,in_RSI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  return;
}

Assistant:

void ScaleTexture::readFrom(BinaryReader &binary) 
  {
    Texture::readFrom(binary);
    binary.read(tex1);
    binary.read(tex2);
    binary.read(scale1);
    binary.read(scale2);
  }